

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

PStruct * FindStructType(FName *name)

{
  PClass *pPVar1;
  int iVar2;
  PType *pPVar3;
  FName local_1c;
  PClass *local_18;
  PStruct *ccls;
  FName *name_local;
  
  ccls = (PStruct *)name;
  FName::FName(&local_1c,name);
  local_18 = PClass::FindClass(&local_1c);
  pPVar1 = PStruct::RegistrationInfo.MyClass;
  if (local_18 == (PClass *)0x0) {
    iVar2 = FName::operator_cast_to_int(name);
    pPVar3 = FTypeTable::FindType(&TypeTable,pPVar1,0,(long)iVar2,(size_t *)0x0);
    local_18 = (PClass *)dyn_cast<PStruct>((DObject *)pPVar3);
    pPVar1 = PNativeStruct::RegistrationInfo.MyClass;
    if (local_18 == (PClass *)0x0) {
      iVar2 = FName::operator_cast_to_int(name);
      pPVar3 = FTypeTable::FindType(&TypeTable,pPVar1,0,(long)iVar2,(size_t *)0x0);
      local_18 = (PClass *)dyn_cast<PStruct>((DObject *)pPVar3);
    }
  }
  return (PStruct *)local_18;
}

Assistant:

static PStruct *FindStructType(FName name)
{
	PStruct *ccls = PClass::FindClass(name);
	if (ccls == nullptr)
	{
		ccls = dyn_cast<PStruct>(TypeTable.FindType(RUNTIME_CLASS(PStruct), 0, (intptr_t)name, nullptr));
		if (ccls == nullptr) ccls = dyn_cast<PStruct>(TypeTable.FindType(RUNTIME_CLASS(PNativeStruct), 0, (intptr_t)name, nullptr));
	}
	return ccls;
}